

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_mp_divmod(void)

{
  ulong in_RAX;
  mp_int *r;
  mp_int *r_00;
  mp_int *q_out;
  mp_int *r_out;
  size_t sVar1;
  ulong uVar2;
  uint8_t sizes [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  r = mp_new(0x100);
  r_00 = mp_new(0x100);
  q_out = mp_new(0x100);
  r_out = mp_new(0x100);
  sVar1 = (*looplimit)(0x20);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      random_read((void *)((long)&uStack_38 + 6),2);
      mp_random_bits_into(r,uStack_38 >> 0x30 & 0xff);
      mp_random_bits_into(r_00,uStack_38 >> 0x38);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      mp_divmod_into(r,r_00,q_out,r_out);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      uVar2 = uVar2 + 1;
      sVar1 = (*looplimit)(0x20);
    } while (uVar2 < sVar1);
  }
  mp_free(r);
  mp_free(r_00);
  mp_free(q_out);
  mp_free(r_out);
  return;
}

Assistant:

static void test_mp_divmod(void)
{
    mp_int *n = mp_new(256), *d = mp_new(256);
    mp_int *q = mp_new(256), *r = mp_new(256);

    for (size_t i = 0; i < looplimit(32); i++) {
        uint8_t sizes[2];
        random_read(sizes, 2);
        mp_random_bits_into(n, sizes[0]);
        mp_random_bits_into(d, sizes[1]);
        log_start();
        mp_divmod_into(n, d, q, r);
        log_end();
    }

    mp_free(n);
    mp_free(d);
    mp_free(q);
    mp_free(r);
}